

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_ideal_endpoints_and_weights.cpp
# Opt level: O0

void compute_quantized_weights_for_decimation
               (decimation_info *di,float low_bound,float high_bound,float *dec_weight_ideal_value,
               float *weight_set_out,uint8_t *quantized_weight_set,quant_method quant_level)

{
  undefined8 *puVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  uint uVar43;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  quant_method in_R8D;
  float in_XMM0_Da;
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [16];
  float in_XMM1_Da;
  vint weight_1;
  vmask mask_1;
  vfloat ixh_1;
  vfloat ixl_1;
  vint ixhi_1;
  vint ixli_1;
  vint weighth_1;
  vint weightl_1;
  vfloat ix1_1;
  vfloat ix_1;
  int i_1;
  vtable_32x8 table_1;
  vint weight;
  vmask mask;
  vfloat ixh;
  vfloat ixl;
  vint ixhi;
  vint ixli;
  vint weighth;
  vint weightl;
  vfloat ix1;
  vfloat ix;
  int i;
  vtable_16x8 table;
  vfloat low_boundv;
  vfloat rscalev;
  vfloat quant_level_m1v;
  vfloat scaled_low_boundv;
  vfloat scalev;
  float scaled_low_bound;
  float scale;
  float rscale;
  float quant_level_m1;
  vint steps_m1;
  quant_and_transfer_table *qat;
  int weight_count;
  int local_3a84;
  undefined1 local_3a60 [16];
  undefined1 auStack_3a50 [16];
  int local_3464;
  undefined8 local_3440;
  undefined8 uStack_3438;
  undefined8 uStack_3430;
  undefined8 uStack_3428;
  undefined8 local_3420;
  undefined8 uStack_3418;
  undefined8 uStack_3410;
  float fStack_3408;
  undefined8 local_3400;
  undefined8 uStack_33f8;
  undefined8 uStack_33f0;
  float fStack_33e8;
  undefined8 local_33e0;
  undefined8 uStack_33d8;
  undefined8 uStack_33d0;
  undefined8 uStack_33c8;
  undefined8 local_33c0;
  undefined8 uStack_33b8;
  undefined8 uStack_33b0;
  float fStack_33a8;
  float local_3390;
  float local_338c;
  float local_3388;
  float local_3384;
  undefined1 local_3380 [16];
  undefined1 auStack_3370 [16];
  quant_and_transfer_table *local_3360;
  uint local_3358;
  quant_method local_3354;
  long local_3350;
  long local_3348;
  long local_3340;
  float local_3338;
  float local_3334;
  float local_2cfc;
  undefined8 *local_2cf8;
  float local_2cec;
  undefined8 *local_2ce8;
  float local_2cdc;
  undefined8 *local_2cd8;
  float local_2ccc;
  undefined8 *local_2cc8;
  float local_2cbc;
  undefined8 *local_2cb8;
  uint local_2c8c;
  undefined1 *local_2c88;
  undefined8 uStack_2c50;
  undefined8 uStack_2c48;
  undefined8 local_2410;
  undefined8 local_2400;
  undefined8 uStack_23f8;
  undefined1 auStack_23d0 [16];
  undefined8 local_2310;
  undefined8 local_2300;
  undefined8 uStack_22f8;
  undefined1 auStack_22d0 [16];
  ulong local_2200;
  ulong uStack_21f8;
  ulong uStack_21f0;
  ulong uStack_21e8;
  ulong local_2180;
  ulong uStack_2178;
  ulong uStack_2170;
  ulong uStack_2168;
  ulong local_2160;
  ulong uStack_2158;
  ulong uStack_2150;
  ulong uStack_2148;
  ulong local_20c0;
  ulong uStack_20b8;
  ulong uStack_20b0;
  ulong uStack_20a8;
  ulong local_20a0;
  ulong uStack_2098;
  ulong uStack_2090;
  ulong uStack_2088;
  float local_19e0;
  float fStack_19dc;
  float fStack_19d8;
  float fStack_19d4;
  float fStack_19d0;
  float fStack_19cc;
  float local_19c0;
  float fStack_19bc;
  float fStack_19b8;
  float fStack_19b4;
  float fStack_19b0;
  float fStack_19ac;
  float fStack_19a8;
  undefined4 uStack_19a4;
  float local_19a0;
  float fStack_199c;
  float fStack_1998;
  float fStack_1994;
  float fStack_1990;
  float fStack_198c;
  float local_1980;
  float fStack_197c;
  float fStack_1978;
  float fStack_1974;
  float fStack_1970;
  float fStack_196c;
  float fStack_1968;
  float fStack_1964;
  float local_1940;
  float fStack_193c;
  float fStack_1938;
  float fStack_1934;
  float fStack_1930;
  float fStack_192c;
  float fStack_1928;
  undefined4 uStack_1924;
  float local_1920;
  float fStack_191c;
  float fStack_1918;
  float fStack_1914;
  float fStack_1910;
  float fStack_190c;
  float local_1900;
  float fStack_18fc;
  float fStack_18f8;
  float fStack_18f4;
  float fStack_18f0;
  float fStack_18ec;
  float fStack_18e8;
  float fStack_18e4;
  float local_18c0;
  float fStack_18bc;
  float fStack_18b8;
  float fStack_18b4;
  float fStack_18b0;
  float fStack_18ac;
  float fStack_18a8;
  undefined4 uStack_18a4;
  float local_1880;
  float fStack_187c;
  float fStack_1878;
  float fStack_1874;
  float fStack_1870;
  float fStack_186c;
  float fStack_1868;
  float fStack_1864;
  float local_1840;
  float fStack_183c;
  float fStack_1838;
  float fStack_1834;
  float fStack_1830;
  float fStack_182c;
  float fStack_1828;
  undefined4 uStack_1824;
  float local_1800;
  float fStack_17fc;
  float fStack_17f8;
  float fStack_17f4;
  float fStack_17f0;
  float fStack_17ec;
  float fStack_17e8;
  float fStack_17e4;
  float local_17e0;
  float fStack_17dc;
  float fStack_17d8;
  float fStack_17d4;
  float fStack_17d0;
  float fStack_17cc;
  float fStack_17c8;
  float fStack_17c4;
  float local_17c0;
  float fStack_17bc;
  float fStack_17b8;
  float fStack_17b4;
  float fStack_17b0;
  float fStack_17ac;
  float fStack_17a8;
  float fStack_17a4;
  float local_17a0;
  float fStack_179c;
  float fStack_1798;
  float fStack_1794;
  float fStack_1790;
  float fStack_178c;
  float fStack_1788;
  float fStack_1784;
  float local_1760;
  float fStack_175c;
  float fStack_1758;
  float fStack_1754;
  float fStack_1750;
  float fStack_174c;
  float fStack_1748;
  float fStack_1744;
  float local_1740;
  float fStack_173c;
  float fStack_1738;
  float fStack_1734;
  float fStack_1730;
  float fStack_172c;
  float fStack_1728;
  float fStack_1724;
  float local_1654;
  float local_1650;
  float local_164c;
  float local_1648;
  float local_1644;
  undefined1 local_1640 [16];
  undefined1 auStack_1630 [16];
  float local_1620;
  float local_161c;
  float local_1618;
  float local_1614;
  float local_1610;
  float local_160c;
  float local_1608;
  float local_1604;
  undefined1 local_1600 [16];
  undefined1 auStack_15f0 [16];
  float local_15e0;
  float local_15dc;
  float local_15d8;
  float local_15d4;
  float local_15d0;
  float local_15cc;
  float local_15c8;
  float local_15c4;
  undefined1 local_15c0 [16];
  undefined1 auStack_15b0 [16];
  float local_15a0;
  float local_159c;
  float local_1598;
  float local_1594;
  float local_1590;
  float local_158c;
  float local_1588;
  float local_1584;
  undefined1 local_1580 [16];
  undefined1 auStack_1570 [16];
  float local_1560;
  float local_155c;
  float local_1558;
  float local_1554;
  float local_1550;
  float local_154c;
  float local_1548;
  float local_1544;
  undefined1 local_1540 [32];
  float local_1520;
  float local_151c;
  float local_1518;
  float local_1514;
  float local_1510;
  float local_150c;
  float local_1508;
  float local_1504;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  ulong uStack_13f8;
  ulong uStack_13d8;
  uint local_e64;
  undefined1 local_e60 [32];
  uint local_e40;
  uint local_e3c;
  uint local_e38;
  uint local_e34;
  uint local_e30;
  uint local_e2c;
  uint local_e28;
  uint local_e24;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  ulong local_ba0;
  ulong uStack_b98;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  local_3358 = (uint)*(byte *)(in_RDI + 2);
  if (local_3358 != 0) {
    local_3360 = quant_and_xfer_tables + in_R8D;
    local_3354 = in_R8D;
    local_3350 = in_RCX;
    local_3348 = in_RDX;
    local_3340 = in_RSI;
    local_3338 = in_XMM1_Da;
    local_3334 = in_XMM0_Da;
    local_2c8c = get_quant_level(in_R8D);
    local_2c8c = local_2c8c - 1;
    local_2c88 = local_3380;
    auVar46 = vpinsrd_avx(ZEXT416(local_2c8c),local_2c8c,1);
    auVar46 = vpinsrd_avx(auVar46,local_2c8c,2);
    auVar46 = vpinsrd_avx(auVar46,local_2c8c,3);
    auVar44 = vpinsrd_avx(ZEXT416(local_2c8c),local_2c8c,1);
    auVar44 = vpinsrd_avx(auVar44,local_2c8c,2);
    auVar44 = vpinsrd_avx(auVar44,local_2c8c,3);
    local_e60._0_16_ = ZEXT116(0) * auVar46 + ZEXT116(1) * auVar44;
    local_e60._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar46;
    local_3384 = compute_quantized_weights_for_decimation::quant_levels_m1[local_3354];
    if (local_3338 <= local_3334) {
      local_3334 = 0.0;
      local_3338 = 1.0;
    }
    local_338c = 1.0 / (local_3338 - local_3334);
    local_3390 = local_3334 * local_338c;
    local_3388 = (local_3338 - local_3334) * 0.015625;
    local_2cf8 = &local_33c0;
    auVar46 = vinsertps_avx(ZEXT416((uint)local_338c),ZEXT416((uint)local_338c),0x10);
    auVar46 = vinsertps_avx(auVar46,ZEXT416((uint)local_338c),0x20);
    local_1640 = vinsertps_avx(auVar46,ZEXT416((uint)local_338c),0x30);
    auVar46 = vinsertps_avx(ZEXT416((uint)local_338c),ZEXT416((uint)local_338c),0x10);
    auVar46 = vinsertps_avx(auVar46,ZEXT416((uint)local_338c),0x20);
    auStack_1630 = vinsertps_avx(auVar46,ZEXT416((uint)local_338c),0x30);
    local_33c0 = local_1640._0_8_;
    uStack_33b8 = local_1640._8_8_;
    uStack_33b0 = auStack_1630._0_8_;
    fStack_33a8 = auStack_1630._8_4_;
    local_2ce8 = &local_33e0;
    auVar46 = vinsertps_avx(ZEXT416((uint)local_3390),ZEXT416((uint)local_3390),0x10);
    auVar46 = vinsertps_avx(auVar46,ZEXT416((uint)local_3390),0x20);
    local_1600 = vinsertps_avx(auVar46,ZEXT416((uint)local_3390),0x30);
    auVar46 = vinsertps_avx(ZEXT416((uint)local_3390),ZEXT416((uint)local_3390),0x10);
    auVar46 = vinsertps_avx(auVar46,ZEXT416((uint)local_3390),0x20);
    auStack_15f0 = vinsertps_avx(auVar46,ZEXT416((uint)local_3390),0x30);
    local_33e0 = local_1600._0_8_;
    uStack_33d8 = local_1600._8_8_;
    uStack_33d0 = auStack_15f0._0_8_;
    uStack_33c8 = auStack_15f0._8_8_;
    local_2cd8 = &local_3400;
    auVar46 = vinsertps_avx(ZEXT416((uint)local_3384),ZEXT416((uint)local_3384),0x10);
    auVar46 = vinsertps_avx(auVar46,ZEXT416((uint)local_3384),0x20);
    local_15c0 = vinsertps_avx(auVar46,ZEXT416((uint)local_3384),0x30);
    auVar46 = vinsertps_avx(ZEXT416((uint)local_3384),ZEXT416((uint)local_3384),0x10);
    auVar46 = vinsertps_avx(auVar46,ZEXT416((uint)local_3384),0x20);
    auStack_15b0 = vinsertps_avx(auVar46,ZEXT416((uint)local_3384),0x30);
    local_3400 = local_15c0._0_8_;
    uStack_33f8 = local_15c0._8_8_;
    uStack_33f0 = auStack_15b0._0_8_;
    fStack_33e8 = auStack_15b0._8_4_;
    local_2cc8 = &local_3420;
    auVar46 = vinsertps_avx(ZEXT416((uint)local_3388),ZEXT416((uint)local_3388),0x10);
    auVar46 = vinsertps_avx(auVar46,ZEXT416((uint)local_3388),0x20);
    local_1580 = vinsertps_avx(auVar46,ZEXT416((uint)local_3388),0x30);
    auVar46 = vinsertps_avx(ZEXT416((uint)local_3388),ZEXT416((uint)local_3388),0x10);
    auVar46 = vinsertps_avx(auVar46,ZEXT416((uint)local_3388),0x20);
    auStack_1570 = vinsertps_avx(auVar46,ZEXT416((uint)local_3388),0x30);
    local_3420 = local_1580._0_8_;
    uStack_3418 = local_1580._8_8_;
    uStack_3410 = auStack_1570._0_8_;
    fStack_3408 = auStack_1570._8_4_;
    local_2cb8 = &local_3440;
    local_2cbc = local_3334;
    local_1654 = local_3334;
    local_1504 = local_3334;
    local_1508 = local_3334;
    local_150c = local_3334;
    local_1510 = local_3334;
    local_1514 = local_3334;
    local_1518 = local_3334;
    local_151c = local_3334;
    local_1520 = local_3334;
    auVar46 = vinsertps_avx(ZEXT416((uint)local_3334),ZEXT416((uint)local_3334),0x10);
    auVar46 = vinsertps_avx(auVar46,ZEXT416((uint)local_3334),0x20);
    auVar46 = vinsertps_avx(auVar46,ZEXT416((uint)local_3334),0x30);
    auVar44 = vinsertps_avx(ZEXT416((uint)local_3334),ZEXT416((uint)local_3334),0x10);
    auVar44 = vinsertps_avx(auVar44,ZEXT416((uint)local_3334),0x20);
    auVar44 = vinsertps_avx(auVar44,ZEXT416((uint)local_3334),0x30);
    auVar45._16_16_ = auVar46;
    auVar45._0_16_ = auVar44;
    local_1540._0_8_ = auVar44._0_8_;
    local_1540._8_8_ = auVar44._8_8_;
    local_1540._16_8_ = auVar46._0_8_;
    local_1540._24_8_ = auVar46._8_8_;
    local_3440 = local_1540._0_8_;
    uStack_3438 = local_1540._8_8_;
    uStack_3430 = local_1540._16_8_;
    uStack_3428 = local_1540._24_8_;
    local_2cfc = local_338c;
    local_2cec = local_3390;
    local_2cdc = local_3384;
    local_2ccc = local_3388;
    local_1650 = local_3388;
    local_164c = local_3384;
    local_1648 = local_3390;
    local_1644 = local_338c;
    local_1620 = local_338c;
    local_161c = local_338c;
    local_1618 = local_338c;
    local_1614 = local_338c;
    local_1610 = local_338c;
    local_160c = local_338c;
    local_1608 = local_338c;
    local_1604 = local_338c;
    local_15e0 = local_3390;
    local_15dc = local_3390;
    local_15d8 = local_3390;
    local_15d4 = local_3390;
    local_15d0 = local_3390;
    local_15cc = local_3390;
    local_15c8 = local_3390;
    local_15c4 = local_3390;
    local_15a0 = local_3384;
    local_159c = local_3384;
    local_1598 = local_3384;
    local_1594 = local_3384;
    local_1590 = local_3384;
    local_158c = local_3384;
    local_1588 = local_3384;
    local_1584 = local_3384;
    local_1560 = local_3388;
    local_155c = local_3388;
    local_1558 = local_3388;
    local_1554 = local_3388;
    local_1550 = local_3388;
    local_154c = local_3388;
    local_1548 = local_3388;
    local_1544 = local_3388;
    local_1540 = auVar45;
    local_e64 = local_2c8c;
    local_e40 = local_2c8c;
    local_e3c = local_2c8c;
    local_e38 = local_2c8c;
    local_e34 = local_2c8c;
    local_e30 = local_2c8c;
    local_e2c = local_2c8c;
    local_e28 = local_2c8c;
    local_e24 = local_2c8c;
    local_3380 = local_e60._0_16_;
    auStack_3370 = local_e60._16_16_;
    uVar43 = get_quant_level(local_3354);
    local_19e0 = (float)local_33c0;
    fStack_19dc = (float)((ulong)local_33c0 >> 0x20);
    fStack_19d8 = (float)uStack_33b8;
    fStack_19d4 = (float)((ulong)uStack_33b8 >> 0x20);
    fStack_19d0 = (float)uStack_33b0;
    fStack_19cc = (float)((ulong)uStack_33b0 >> 0x20);
    local_19a0 = (float)local_3400;
    fStack_199c = (float)((ulong)local_3400 >> 0x20);
    fStack_1998 = (float)uStack_33f8;
    fStack_1994 = (float)((ulong)uStack_33f8 >> 0x20);
    fStack_1990 = (float)uStack_33f0;
    fStack_198c = (float)((ulong)uStack_33f0 >> 0x20);
    local_1920 = (float)local_3420;
    fStack_191c = (float)((ulong)local_3420 >> 0x20);
    fStack_1918 = (float)uStack_3418;
    fStack_1914 = (float)((ulong)uStack_3418 >> 0x20);
    fStack_1910 = (float)uStack_3410;
    fStack_190c = (float)((ulong)uStack_3410 >> 0x20);
    local_17a0 = (float)local_3440;
    fStack_179c = (float)((ulong)local_3440 >> 0x20);
    fStack_1798 = (float)uStack_3438;
    fStack_1794 = (float)((ulong)uStack_3438 >> 0x20);
    fStack_1790 = (float)uStack_3430;
    fStack_178c = (float)((ulong)uStack_3430 >> 0x20);
    fStack_1788 = (float)uStack_3428;
    fStack_1784 = (float)((ulong)uStack_3428 >> 0x20);
    if (uVar43 < 0x11) {
      auVar46 = vlddqu_avx(*(undefined1 (*) [16])local_3360->quant_to_unquant);
      auVar44 = ZEXT116(0) * auVar46 + ZEXT116(1) * auVar46;
      auVar46 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar46;
      uStack_2c48 = auVar46._8_8_;
      uStack_2c50 = auVar46._0_8_;
      for (local_3464 = 0; local_3464 < (int)local_3358; local_3464 = local_3464 + 8) {
        puVar1 = (undefined8 *)(local_3340 + (long)local_3464 * 4);
        local_19c0 = (float)*puVar1;
        fStack_19bc = (float)((ulong)*puVar1 >> 0x20);
        fStack_19b8 = (float)puVar1[1];
        fStack_19b4 = (float)((ulong)puVar1[1] >> 0x20);
        fStack_19b0 = (float)puVar1[2];
        fStack_19ac = (float)((ulong)puVar1[2] >> 0x20);
        fStack_19a8 = (float)puVar1[3];
        uStack_19a4 = (undefined4)((ulong)puVar1[3] >> 0x20);
        auVar10._4_4_ = fStack_19bc * fStack_19dc;
        auVar10._0_4_ = local_19c0 * local_19e0;
        auVar10._12_4_ = fStack_19b4 * fStack_19d4;
        auVar10._8_4_ = fStack_19b8 * fStack_19d8;
        auVar10._20_4_ = fStack_19ac * fStack_19cc;
        auVar10._16_4_ = fStack_19b0 * fStack_19d0;
        auVar10._28_4_ = uStack_19a4;
        auVar10._24_4_ = fStack_19a8 * fStack_33a8;
        auVar9._8_8_ = uStack_33d8;
        auVar9._0_8_ = local_33e0;
        auVar9._16_8_ = uStack_33d0;
        auVar9._24_8_ = uStack_33c8;
        auVar45 = vsubps_avx(auVar10,auVar9);
        uStack_13f8 = SUB328(ZEXT832(0),4);
        auVar45 = vmaxps_avx(auVar45,ZEXT832(uStack_13f8) << 0x40);
        auVar46 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar46 = vinsertps_avx(auVar46,ZEXT416(0x3f800000),0x20);
        auVar46 = vinsertps_avx(auVar46,ZEXT416(0x3f800000),0x30);
        auVar3 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3f800000),0x20);
        auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3f800000),0x30);
        uStack_1430 = auVar3._0_8_;
        uStack_1428 = auVar3._8_8_;
        auVar15._16_8_ = uStack_1430;
        auVar15._0_16_ = auVar46;
        auVar15._24_8_ = uStack_1428;
        auVar45 = vminps_avx(auVar45,auVar15);
        local_1980 = auVar45._0_4_;
        fStack_197c = auVar45._4_4_;
        fStack_1978 = auVar45._8_4_;
        fStack_1974 = auVar45._12_4_;
        fStack_1970 = auVar45._16_4_;
        fStack_196c = auVar45._20_4_;
        fStack_1968 = auVar45._24_4_;
        fStack_1964 = auVar45._28_4_;
        uVar11 = CONCAT44((int)(fStack_197c * fStack_199c),(int)(local_1980 * local_19a0));
        uVar12 = CONCAT44((int)(fStack_1974 * fStack_1994),(int)(fStack_1978 * fStack_1998));
        uVar13 = CONCAT44((int)(fStack_196c * fStack_198c),(int)(fStack_1970 * fStack_1990));
        uVar14 = CONCAT44((int)fStack_1964,(int)(fStack_1968 * fStack_33e8));
        auVar46 = vpinsrd_avx(ZEXT416(1),1,1);
        auVar46 = vpinsrd_avx(auVar46,1,2);
        auVar46 = vpinsrd_avx(auVar46,1,3);
        auVar3 = vpinsrd_avx(ZEXT416(1),1,1);
        auVar3 = vpinsrd_avx(auVar3,1,2);
        auVar3 = vpinsrd_avx(auVar3,1,3);
        uStack_e10 = auVar3._0_8_;
        uStack_e08 = auVar3._8_8_;
        auVar20._8_8_ = uVar12;
        auVar20._0_8_ = uVar11;
        auVar20._16_8_ = uVar13;
        auVar20._24_8_ = uVar14;
        auVar19._16_8_ = uStack_e10;
        auVar19._0_16_ = auVar46;
        auVar19._24_8_ = uStack_e08;
        auVar45 = vpaddd_avx2(auVar20,auVar19);
        auVar17._16_8_ = auStack_3370._0_8_;
        auVar17._0_16_ = local_3380;
        auVar17._24_8_ = auStack_3370._8_8_;
        auVar45 = vpminsd_avx2(auVar45,auVar17);
        auVar46 = vpinsrd_avx(ZEXT416(0xffffff00),0xffffff00,1);
        auVar46 = vpinsrd_avx(auVar46,0xffffff00,2);
        auVar46 = vpinsrd_avx(auVar46,0xffffff00,3);
        auVar3 = vpinsrd_avx(ZEXT416(0xffffff00),0xffffff00,1);
        auVar3 = vpinsrd_avx(auVar3,0xffffff00,2);
        auVar3 = vpinsrd_avx(auVar3,0xffffff00,3);
        uStack_d50 = auVar3._0_8_;
        uStack_d48 = auVar3._8_8_;
        auVar27._8_8_ = uVar12;
        auVar27._0_8_ = uVar11;
        auVar27._16_8_ = uVar13;
        auVar27._24_8_ = uVar14;
        auVar26._16_8_ = uStack_d50;
        auVar26._0_16_ = auVar46;
        auVar26._24_8_ = uStack_d48;
        auVar4 = vpor_avx2(auVar27,auVar26);
        auVar41._16_8_ = uStack_2c50;
        auVar41._0_16_ = auVar44;
        auVar41._24_8_ = uStack_2c48;
        auVar5 = vpshufb_avx2(auVar41,auVar4);
        auVar46 = vpinsrd_avx(ZEXT416(0xffffff00),0xffffff00,1);
        auVar46 = vpinsrd_avx(auVar46,0xffffff00,2);
        auVar46 = vpinsrd_avx(auVar46,0xffffff00,3);
        auVar3 = vpinsrd_avx(ZEXT416(0xffffff00),0xffffff00,1);
        auVar3 = vpinsrd_avx(auVar3,0xffffff00,2);
        auVar3 = vpinsrd_avx(auVar3,0xffffff00,3);
        uStack_d90 = auVar3._0_8_;
        uStack_d88 = auVar3._8_8_;
        auVar28._16_8_ = uStack_d90;
        auVar28._0_16_ = auVar46;
        auVar28._24_8_ = uStack_d88;
        auVar45 = vpor_avx2(auVar45,auVar28);
        auVar42._16_8_ = uStack_2c50;
        auVar42._0_16_ = auVar44;
        auVar42._24_8_ = uStack_2c48;
        auVar6 = vpshufb_avx2(auVar42,auVar45);
        auVar4 = vcvtdq2ps_avx(auVar5);
        auVar2 = vcvtdq2ps_avx(auVar6);
        local_17c0 = auVar4._0_4_;
        fStack_17bc = auVar4._4_4_;
        fStack_17b8 = auVar4._8_4_;
        fStack_17b4 = auVar4._12_4_;
        fStack_17b0 = auVar4._16_4_;
        fStack_17ac = auVar4._20_4_;
        fStack_17a8 = auVar4._24_4_;
        fStack_17a4 = auVar4._28_4_;
        local_17e0 = auVar2._0_4_;
        fStack_17dc = auVar2._4_4_;
        fStack_17d8 = auVar2._8_4_;
        fStack_17d4 = auVar2._12_4_;
        fStack_17d0 = auVar2._16_4_;
        fStack_17cc = auVar2._20_4_;
        fStack_17c8 = auVar2._24_4_;
        fStack_17c4 = auVar2._28_4_;
        auVar8._4_4_ = fStack_17bc + fStack_17dc;
        auVar8._0_4_ = local_17c0 + local_17e0;
        auVar8._12_4_ = fStack_17b4 + fStack_17d4;
        auVar8._8_4_ = fStack_17b8 + fStack_17d8;
        auVar8._20_4_ = fStack_17ac + fStack_17cc;
        auVar8._16_4_ = fStack_17b0 + fStack_17d0;
        auVar8._28_4_ = fStack_17a4 + fStack_17c4;
        auVar8._24_4_ = fStack_17a8 + fStack_17c8;
        auVar46 = vinsertps_avx(ZEXT416(0x43000000),ZEXT416(0x43000000),0x10);
        auVar46 = vinsertps_avx(auVar46,ZEXT416(0x43000000),0x20);
        auVar46 = vinsertps_avx(auVar46,ZEXT416(0x43000000),0x30);
        auVar3 = vinsertps_avx(ZEXT416(0x43000000),ZEXT416(0x43000000),0x10);
        auVar3 = vinsertps_avx(auVar3,ZEXT416(0x43000000),0x20);
        auVar3 = vinsertps_avx(auVar3,ZEXT416(0x43000000),0x30);
        local_1940 = auVar46._0_4_;
        fStack_193c = auVar46._4_4_;
        fStack_1938 = auVar46._8_4_;
        fStack_1934 = auVar46._12_4_;
        fStack_1930 = auVar3._0_4_;
        fStack_192c = auVar3._4_4_;
        fStack_1928 = auVar3._8_4_;
        uStack_1924 = auVar3._12_4_;
        auVar7._4_4_ = fStack_193c * fStack_197c;
        auVar7._0_4_ = local_1940 * local_1980;
        auVar7._12_4_ = fStack_1934 * fStack_1974;
        auVar7._8_4_ = fStack_1938 * fStack_1978;
        auVar7._20_4_ = fStack_192c * fStack_196c;
        auVar7._16_4_ = fStack_1930 * fStack_1970;
        auVar7._28_4_ = uStack_1924;
        auVar7._24_4_ = fStack_1928 * fStack_1968;
        auVar45 = vcmpps_avx(auVar8,auVar7,1);
        auVar5 = vpblendvb_avx2(auVar5,auVar6,auVar45);
        auVar45 = vblendvps_avx(auVar4,auVar2,auVar45);
        local_1900 = auVar45._0_4_;
        fStack_18fc = auVar45._4_4_;
        fStack_18f8 = auVar45._8_4_;
        fStack_18f4 = auVar45._12_4_;
        fStack_18f0 = auVar45._16_4_;
        fStack_18ec = auVar45._20_4_;
        fStack_18e8 = auVar45._24_4_;
        fStack_18e4 = auVar45._28_4_;
        puVar1 = (undefined8 *)(local_3348 + (long)local_3464 * 4);
        *puVar1 = CONCAT44(fStack_18fc * fStack_191c + fStack_179c,
                           local_1900 * local_1920 + local_17a0);
        puVar1[1] = CONCAT44(fStack_18f4 * fStack_1914 + fStack_1794,
                             fStack_18f8 * fStack_1918 + fStack_1798);
        puVar1[2] = CONCAT44(fStack_18ec * fStack_190c + fStack_178c,
                             fStack_18f0 * fStack_1910 + fStack_1790);
        puVar1[3] = CONCAT44(fStack_18e4 + fStack_1784,fStack_18e8 * fStack_3408 + fStack_1788);
        auVar46 = vpinsrb_avx(ZEXT116(0),4,1);
        auVar46 = vpinsrb_avx(auVar46,8,2);
        auVar46 = vpinsrb_avx(auVar46,0xc,3);
        auVar46 = vpinsrb_avx(auVar46,0,4);
        auVar46 = vpinsrb_avx(auVar46,0,5);
        auVar46 = vpinsrb_avx(auVar46,0,6);
        auVar46 = vpinsrb_avx(auVar46,0,7);
        auVar46 = vpinsrb_avx(auVar46,0,8);
        auVar46 = vpinsrb_avx(auVar46,0,9);
        auVar46 = vpinsrb_avx(auVar46,0,10);
        auVar46 = vpinsrb_avx(auVar46,0,0xb);
        auVar46 = vpinsrb_avx(auVar46,0,0xc);
        auVar46 = vpinsrb_avx(auVar46,0,0xd);
        auVar46 = vpinsrb_avx(auVar46,0,0xe);
        auVar46 = vpinsrb_avx(auVar46,0,0xf);
        auVar3 = vpinsrb_avx(ZEXT116(0x10),0x14,1);
        auVar3 = vpinsrb_avx(auVar3,0x18,2);
        auVar3 = vpinsrb_avx(auVar3,0x1c,3);
        auVar3 = vpinsrb_avx(auVar3,0,4);
        auVar3 = vpinsrb_avx(auVar3,0,5);
        auVar3 = vpinsrb_avx(auVar3,0,6);
        auVar3 = vpinsrb_avx(auVar3,0,7);
        auVar3 = vpinsrb_avx(auVar3,0,8);
        auVar3 = vpinsrb_avx(auVar3,0,9);
        auVar3 = vpinsrb_avx(auVar3,0,10);
        auVar3 = vpinsrb_avx(auVar3,0,0xb);
        auVar3 = vpinsrb_avx(auVar3,0,0xc);
        auVar3 = vpinsrb_avx(auVar3,0,0xd);
        auVar3 = vpinsrb_avx(auVar3,0,0xe);
        auVar3 = vpinsrb_avx(auVar3,0,0xf);
        uStack_450 = auVar3._0_8_;
        uStack_448 = auVar3._8_8_;
        auVar29._16_8_ = uStack_450;
        auVar29._0_16_ = auVar46;
        auVar29._24_8_ = uStack_448;
        auVar45 = vpshufb_avx2(auVar5,auVar29);
        auStack_22d0 = auVar45._16_16_;
        auVar46._8_8_ = uStack_22f8;
        auVar46._0_8_ = local_2300;
        auVar46 = vpunpckldq_avx(auStack_22d0,auVar46);
        local_2310 = auVar46._0_8_;
        *(undefined8 *)(local_3350 + local_3464) = local_2310;
      }
    }
    else {
      auVar46 = vlddqu_avx(*(undefined1 (*) [16])local_3360->quant_to_unquant);
      local_ba0 = auVar46._0_8_;
      uStack_b98 = auVar46._8_8_;
      auVar44 = vlddqu_avx(*(undefined1 (*) [16])(local_3360->quant_to_unquant + 0x10));
      local_3a60 = ZEXT116(0) * auVar44 + ZEXT116(1) * auVar44;
      auStack_3a50 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar44;
      uStack_21f8 = local_3a60._8_8_;
      local_2200 = local_3a60._0_8_;
      uStack_21e8 = auStack_3a50._8_8_;
      uStack_21f0 = auStack_3a50._0_8_;
      local_3a60._0_8_ = local_2200 ^ local_ba0;
      local_3a60._8_8_ = uStack_21f8 ^ uStack_b98;
      auStack_3a50._0_8_ = uStack_21f0 ^ local_ba0;
      auStack_3a50._8_8_ = uStack_21e8 ^ uStack_b98;
      auStack_3a50._8_8_ = SUB168(auStack_3a50,8);
      auStack_3a50._0_8_ = SUB168(auStack_3a50,0);
      for (local_3a84 = 0; local_3a84 < (int)local_3358; local_3a84 = local_3a84 + 8) {
        puVar1 = (undefined8 *)(local_3340 + (long)local_3a84 * 4);
        local_18c0 = (float)*puVar1;
        fStack_18bc = (float)((ulong)*puVar1 >> 0x20);
        fStack_18b8 = (float)puVar1[1];
        fStack_18b4 = (float)((ulong)puVar1[1] >> 0x20);
        fStack_18b0 = (float)puVar1[2];
        fStack_18ac = (float)((ulong)puVar1[2] >> 0x20);
        fStack_18a8 = (float)puVar1[3];
        uStack_18a4 = (undefined4)((ulong)puVar1[3] >> 0x20);
        auVar2._4_4_ = fStack_18bc * fStack_19dc;
        auVar2._0_4_ = local_18c0 * local_19e0;
        auVar2._12_4_ = fStack_18b4 * fStack_19d4;
        auVar2._8_4_ = fStack_18b8 * fStack_19d8;
        auVar2._20_4_ = fStack_18ac * fStack_19cc;
        auVar2._16_4_ = fStack_18b0 * fStack_19d0;
        auVar2._28_4_ = uStack_18a4;
        auVar2._24_4_ = fStack_18a8 * fStack_33a8;
        auVar4._8_8_ = uStack_33d8;
        auVar4._0_8_ = local_33e0;
        auVar4._16_8_ = uStack_33d0;
        auVar4._24_8_ = uStack_33c8;
        auVar45 = vsubps_avx(auVar2,auVar4);
        uStack_13d8 = SUB328(ZEXT832(0),4);
        auVar45 = vmaxps_avx(auVar45,ZEXT832(uStack_13d8) << 0x40);
        auVar44 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar44 = vinsertps_avx(auVar44,ZEXT416(0x3f800000),0x20);
        auVar44 = vinsertps_avx(auVar44,ZEXT416(0x3f800000),0x30);
        auVar3 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3f800000),0x20);
        auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3f800000),0x30);
        uStack_1470 = auVar3._0_8_;
        uStack_1468 = auVar3._8_8_;
        auVar16._16_8_ = uStack_1470;
        auVar16._0_16_ = auVar44;
        auVar16._24_8_ = uStack_1468;
        auVar45 = vminps_avx(auVar45,auVar16);
        local_1880 = auVar45._0_4_;
        fStack_187c = auVar45._4_4_;
        fStack_1878 = auVar45._8_4_;
        fStack_1874 = auVar45._12_4_;
        fStack_1870 = auVar45._16_4_;
        fStack_186c = auVar45._20_4_;
        fStack_1868 = auVar45._24_4_;
        fStack_1864 = auVar45._28_4_;
        uVar11 = CONCAT44((int)(fStack_187c * fStack_199c),(int)(local_1880 * local_19a0));
        uVar12 = CONCAT44((int)(fStack_1874 * fStack_1994),(int)(fStack_1878 * fStack_1998));
        uVar13 = CONCAT44((int)(fStack_186c * fStack_198c),(int)(fStack_1870 * fStack_1990));
        uVar14 = CONCAT44((int)fStack_1864,(int)(fStack_1868 * fStack_33e8));
        auVar44 = vpinsrd_avx(ZEXT416(1),1,1);
        auVar44 = vpinsrd_avx(auVar44,1,2);
        auVar44 = vpinsrd_avx(auVar44,1,3);
        auVar3 = vpinsrd_avx(ZEXT416(1),1,1);
        auVar3 = vpinsrd_avx(auVar3,1,2);
        auVar3 = vpinsrd_avx(auVar3,1,3);
        uStack_dd0 = auVar3._0_8_;
        uStack_dc8 = auVar3._8_8_;
        auVar22._8_8_ = uVar12;
        auVar22._0_8_ = uVar11;
        auVar22._16_8_ = uVar13;
        auVar22._24_8_ = uVar14;
        auVar21._16_8_ = uStack_dd0;
        auVar21._0_16_ = auVar44;
        auVar21._24_8_ = uStack_dc8;
        auVar45 = vpaddd_avx2(auVar22,auVar21);
        auVar18._16_8_ = auStack_3370._0_8_;
        auVar18._0_16_ = local_3380;
        auVar18._24_8_ = auStack_3370._8_8_;
        auVar45 = vpminsd_avx2(auVar45,auVar18);
        auVar44 = vpinsrd_avx(ZEXT416(0xffffff00),0xffffff00,1);
        auVar44 = vpinsrd_avx(auVar44,0xffffff00,2);
        auVar44 = vpinsrd_avx(auVar44,0xffffff00,3);
        auVar3 = vpinsrd_avx(ZEXT416(0xffffff00),0xffffff00,1);
        auVar3 = vpinsrd_avx(auVar3,0xffffff00,2);
        auVar3 = vpinsrd_avx(auVar3,0xffffff00,3);
        uStack_cd0 = auVar3._0_8_;
        uStack_cc8 = auVar3._8_8_;
        auVar24._8_8_ = uVar12;
        auVar24._0_8_ = uVar11;
        auVar24._16_8_ = uVar13;
        auVar24._24_8_ = uVar14;
        auVar23._16_8_ = uStack_cd0;
        auVar23._0_16_ = auVar44;
        auVar23._24_8_ = uStack_cc8;
        auVar4 = vpor_avx2(auVar24,auVar23);
        auVar37._16_8_ = local_ba0;
        auVar37._0_16_ = auVar46;
        auVar37._24_8_ = uStack_b98;
        auVar2 = vpshufb_avx2(auVar37,auVar4);
        auVar44 = vpinsrb_avx(ZEXT116(0x10),0x10,1);
        auVar44 = vpinsrb_avx(auVar44,0x10,2);
        auVar44 = vpinsrb_avx(auVar44,0x10,3);
        auVar44 = vpinsrb_avx(auVar44,0x10,4);
        auVar44 = vpinsrb_avx(auVar44,0x10,5);
        auVar44 = vpinsrb_avx(auVar44,0x10,6);
        auVar44 = vpinsrb_avx(auVar44,0x10,7);
        auVar44 = vpinsrb_avx(auVar44,0x10,8);
        auVar44 = vpinsrb_avx(auVar44,0x10,9);
        auVar44 = vpinsrb_avx(auVar44,0x10,10);
        auVar44 = vpinsrb_avx(auVar44,0x10,0xb);
        auVar44 = vpinsrb_avx(auVar44,0x10,0xc);
        auVar44 = vpinsrb_avx(auVar44,0x10,0xd);
        auVar44 = vpinsrb_avx(auVar44,0x10,0xe);
        auVar44 = vpinsrb_avx(auVar44,0x10,0xf);
        auVar3 = vpinsrb_avx(ZEXT116(0x10),0x10,1);
        auVar3 = vpinsrb_avx(auVar3,0x10,2);
        auVar3 = vpinsrb_avx(auVar3,0x10,3);
        auVar3 = vpinsrb_avx(auVar3,0x10,4);
        auVar3 = vpinsrb_avx(auVar3,0x10,5);
        auVar3 = vpinsrb_avx(auVar3,0x10,6);
        auVar3 = vpinsrb_avx(auVar3,0x10,7);
        auVar3 = vpinsrb_avx(auVar3,0x10,8);
        auVar3 = vpinsrb_avx(auVar3,0x10,9);
        auVar3 = vpinsrb_avx(auVar3,0x10,10);
        auVar3 = vpinsrb_avx(auVar3,0x10,0xb);
        auVar3 = vpinsrb_avx(auVar3,0x10,0xc);
        auVar3 = vpinsrb_avx(auVar3,0x10,0xd);
        auVar3 = vpinsrb_avx(auVar3,0x10,0xe);
        auVar3 = vpinsrb_avx(auVar3,0x10,0xf);
        uStack_d0 = auVar3._0_8_;
        uStack_c8 = auVar3._8_8_;
        auVar35._16_8_ = uStack_d0;
        auVar35._0_16_ = auVar44;
        auVar35._24_8_ = uStack_c8;
        auVar4 = vpsubb_avx2(auVar4,auVar35);
        auVar39._16_8_ = auStack_3a50._0_8_;
        auVar39._0_16_ = local_3a60;
        auVar39._24_8_ = auStack_3a50._8_8_;
        auVar4 = vpshufb_avx2(auVar39,auVar4);
        local_20a0 = auVar2._0_8_;
        uStack_2098 = auVar2._8_8_;
        uStack_2090 = auVar2._16_8_;
        uStack_2088 = auVar2._24_8_;
        local_20c0 = auVar4._0_8_;
        uStack_20b8 = auVar4._8_8_;
        uStack_20b0 = auVar4._16_8_;
        uStack_20a8 = auVar4._24_8_;
        auVar44 = vpinsrd_avx(ZEXT416(0xffffff00),0xffffff00,1);
        auVar44 = vpinsrd_avx(auVar44,0xffffff00,2);
        auVar44 = vpinsrd_avx(auVar44,0xffffff00,3);
        auVar3 = vpinsrd_avx(ZEXT416(0xffffff00),0xffffff00,1);
        auVar3 = vpinsrd_avx(auVar3,0xffffff00,2);
        auVar3 = vpinsrd_avx(auVar3,0xffffff00,3);
        uStack_d10 = auVar3._0_8_;
        uStack_d08 = auVar3._8_8_;
        auVar25._16_8_ = uStack_d10;
        auVar25._0_16_ = auVar44;
        auVar25._24_8_ = uStack_d08;
        auVar45 = vpor_avx2(auVar45,auVar25);
        auVar38._16_8_ = local_ba0;
        auVar38._0_16_ = auVar46;
        auVar38._24_8_ = uStack_b98;
        auVar4 = vpshufb_avx2(auVar38,auVar45);
        auVar44 = vpinsrb_avx(ZEXT116(0x10),0x10,1);
        auVar44 = vpinsrb_avx(auVar44,0x10,2);
        auVar44 = vpinsrb_avx(auVar44,0x10,3);
        auVar44 = vpinsrb_avx(auVar44,0x10,4);
        auVar44 = vpinsrb_avx(auVar44,0x10,5);
        auVar44 = vpinsrb_avx(auVar44,0x10,6);
        auVar44 = vpinsrb_avx(auVar44,0x10,7);
        auVar44 = vpinsrb_avx(auVar44,0x10,8);
        auVar44 = vpinsrb_avx(auVar44,0x10,9);
        auVar44 = vpinsrb_avx(auVar44,0x10,10);
        auVar44 = vpinsrb_avx(auVar44,0x10,0xb);
        auVar44 = vpinsrb_avx(auVar44,0x10,0xc);
        auVar44 = vpinsrb_avx(auVar44,0x10,0xd);
        auVar44 = vpinsrb_avx(auVar44,0x10,0xe);
        auVar44 = vpinsrb_avx(auVar44,0x10,0xf);
        auVar3 = vpinsrb_avx(ZEXT116(0x10),0x10,1);
        auVar3 = vpinsrb_avx(auVar3,0x10,2);
        auVar3 = vpinsrb_avx(auVar3,0x10,3);
        auVar3 = vpinsrb_avx(auVar3,0x10,4);
        auVar3 = vpinsrb_avx(auVar3,0x10,5);
        auVar3 = vpinsrb_avx(auVar3,0x10,6);
        auVar3 = vpinsrb_avx(auVar3,0x10,7);
        auVar3 = vpinsrb_avx(auVar3,0x10,8);
        auVar3 = vpinsrb_avx(auVar3,0x10,9);
        auVar3 = vpinsrb_avx(auVar3,0x10,10);
        auVar3 = vpinsrb_avx(auVar3,0x10,0xb);
        auVar3 = vpinsrb_avx(auVar3,0x10,0xc);
        auVar3 = vpinsrb_avx(auVar3,0x10,0xd);
        auVar3 = vpinsrb_avx(auVar3,0x10,0xe);
        auVar3 = vpinsrb_avx(auVar3,0x10,0xf);
        uStack_70 = auVar3._0_8_;
        uStack_68 = auVar3._8_8_;
        auVar36._16_8_ = uStack_70;
        auVar36._0_16_ = auVar44;
        auVar36._24_8_ = uStack_68;
        auVar45 = vpsubb_avx2(auVar45,auVar36);
        auVar40._16_8_ = auStack_3a50._0_8_;
        auVar40._0_16_ = local_3a60;
        auVar40._24_8_ = auStack_3a50._8_8_;
        auVar45 = vpshufb_avx2(auVar40,auVar45);
        local_2160 = auVar4._0_8_;
        uStack_2158 = auVar4._8_8_;
        uStack_2150 = auVar4._16_8_;
        uStack_2148 = auVar4._24_8_;
        local_2180 = auVar45._0_8_;
        uStack_2178 = auVar45._8_8_;
        uStack_2170 = auVar45._16_8_;
        uStack_2168 = auVar45._24_8_;
        auVar31._8_8_ = uStack_2098 ^ uStack_20b8;
        auVar31._0_8_ = local_20a0 ^ local_20c0;
        auVar31._16_8_ = uStack_2090 ^ uStack_20b0;
        auVar31._24_8_ = uStack_2088 ^ uStack_20a8;
        auVar4 = vcvtdq2ps_avx(auVar31);
        auVar32._8_8_ = uStack_2158 ^ uStack_2178;
        auVar32._0_8_ = local_2160 ^ local_2180;
        auVar32._16_8_ = uStack_2150 ^ uStack_2170;
        auVar32._24_8_ = uStack_2148 ^ uStack_2168;
        auVar2 = vcvtdq2ps_avx(auVar32);
        local_1740 = auVar4._0_4_;
        fStack_173c = auVar4._4_4_;
        fStack_1738 = auVar4._8_4_;
        fStack_1734 = auVar4._12_4_;
        fStack_1730 = auVar4._16_4_;
        fStack_172c = auVar4._20_4_;
        fStack_1728 = auVar4._24_4_;
        fStack_1724 = auVar4._28_4_;
        local_1760 = auVar2._0_4_;
        fStack_175c = auVar2._4_4_;
        fStack_1758 = auVar2._8_4_;
        fStack_1754 = auVar2._12_4_;
        fStack_1750 = auVar2._16_4_;
        fStack_174c = auVar2._20_4_;
        fStack_1748 = auVar2._24_4_;
        fStack_1744 = auVar2._28_4_;
        auVar6._4_4_ = fStack_173c + fStack_175c;
        auVar6._0_4_ = local_1740 + local_1760;
        auVar6._12_4_ = fStack_1734 + fStack_1754;
        auVar6._8_4_ = fStack_1738 + fStack_1758;
        auVar6._20_4_ = fStack_172c + fStack_174c;
        auVar6._16_4_ = fStack_1730 + fStack_1750;
        auVar6._28_4_ = fStack_1724 + fStack_1744;
        auVar6._24_4_ = fStack_1728 + fStack_1748;
        auVar44 = vinsertps_avx(ZEXT416(0x43000000),ZEXT416(0x43000000),0x10);
        auVar44 = vinsertps_avx(auVar44,ZEXT416(0x43000000),0x20);
        auVar44 = vinsertps_avx(auVar44,ZEXT416(0x43000000),0x30);
        auVar3 = vinsertps_avx(ZEXT416(0x43000000),ZEXT416(0x43000000),0x10);
        auVar3 = vinsertps_avx(auVar3,ZEXT416(0x43000000),0x20);
        auVar3 = vinsertps_avx(auVar3,ZEXT416(0x43000000),0x30);
        local_1840 = auVar44._0_4_;
        fStack_183c = auVar44._4_4_;
        fStack_1838 = auVar44._8_4_;
        fStack_1834 = auVar44._12_4_;
        fStack_1830 = auVar3._0_4_;
        fStack_182c = auVar3._4_4_;
        fStack_1828 = auVar3._8_4_;
        uStack_1824 = auVar3._12_4_;
        auVar5._4_4_ = fStack_183c * fStack_187c;
        auVar5._0_4_ = local_1840 * local_1880;
        auVar5._12_4_ = fStack_1834 * fStack_1874;
        auVar5._8_4_ = fStack_1838 * fStack_1878;
        auVar5._20_4_ = fStack_182c * fStack_186c;
        auVar5._16_4_ = fStack_1830 * fStack_1870;
        auVar5._28_4_ = uStack_1824;
        auVar5._24_4_ = fStack_1828 * fStack_1868;
        auVar45 = vcmpps_avx(auVar6,auVar5,1);
        auVar34._8_8_ = uStack_2098 ^ uStack_20b8;
        auVar34._0_8_ = local_20a0 ^ local_20c0;
        auVar34._16_8_ = uStack_2090 ^ uStack_20b0;
        auVar34._24_8_ = uStack_2088 ^ uStack_20a8;
        auVar33._8_8_ = uStack_2158 ^ uStack_2178;
        auVar33._0_8_ = local_2160 ^ local_2180;
        auVar33._16_8_ = uStack_2150 ^ uStack_2170;
        auVar33._24_8_ = uStack_2148 ^ uStack_2168;
        auVar5 = vpblendvb_avx2(auVar34,auVar33,auVar45);
        auVar45 = vblendvps_avx(auVar4,auVar2,auVar45);
        local_1800 = auVar45._0_4_;
        fStack_17fc = auVar45._4_4_;
        fStack_17f8 = auVar45._8_4_;
        fStack_17f4 = auVar45._12_4_;
        fStack_17f0 = auVar45._16_4_;
        fStack_17ec = auVar45._20_4_;
        fStack_17e8 = auVar45._24_4_;
        fStack_17e4 = auVar45._28_4_;
        puVar1 = (undefined8 *)(local_3348 + (long)local_3a84 * 4);
        *puVar1 = CONCAT44(fStack_17fc * fStack_191c + fStack_179c,
                           local_1800 * local_1920 + local_17a0);
        puVar1[1] = CONCAT44(fStack_17f4 * fStack_1914 + fStack_1794,
                             fStack_17f8 * fStack_1918 + fStack_1798);
        puVar1[2] = CONCAT44(fStack_17ec * fStack_190c + fStack_178c,
                             fStack_17f0 * fStack_1910 + fStack_1790);
        puVar1[3] = CONCAT44(fStack_17e4 + fStack_1784,fStack_17e8 * fStack_3408 + fStack_1788);
        auVar44 = vpinsrb_avx(ZEXT116(0),4,1);
        auVar44 = vpinsrb_avx(auVar44,8,2);
        auVar44 = vpinsrb_avx(auVar44,0xc,3);
        auVar44 = vpinsrb_avx(auVar44,0,4);
        auVar44 = vpinsrb_avx(auVar44,0,5);
        auVar44 = vpinsrb_avx(auVar44,0,6);
        auVar44 = vpinsrb_avx(auVar44,0,7);
        auVar44 = vpinsrb_avx(auVar44,0,8);
        auVar44 = vpinsrb_avx(auVar44,0,9);
        auVar44 = vpinsrb_avx(auVar44,0,10);
        auVar44 = vpinsrb_avx(auVar44,0,0xb);
        auVar44 = vpinsrb_avx(auVar44,0,0xc);
        auVar44 = vpinsrb_avx(auVar44,0,0xd);
        auVar44 = vpinsrb_avx(auVar44,0,0xe);
        auVar44 = vpinsrb_avx(auVar44,0,0xf);
        auVar3 = vpinsrb_avx(ZEXT116(0x10),0x14,1);
        auVar3 = vpinsrb_avx(auVar3,0x18,2);
        auVar3 = vpinsrb_avx(auVar3,0x1c,3);
        auVar3 = vpinsrb_avx(auVar3,0,4);
        auVar3 = vpinsrb_avx(auVar3,0,5);
        auVar3 = vpinsrb_avx(auVar3,0,6);
        auVar3 = vpinsrb_avx(auVar3,0,7);
        auVar3 = vpinsrb_avx(auVar3,0,8);
        auVar3 = vpinsrb_avx(auVar3,0,9);
        auVar3 = vpinsrb_avx(auVar3,0,10);
        auVar3 = vpinsrb_avx(auVar3,0,0xb);
        auVar3 = vpinsrb_avx(auVar3,0,0xc);
        auVar3 = vpinsrb_avx(auVar3,0,0xd);
        auVar3 = vpinsrb_avx(auVar3,0,0xe);
        auVar3 = vpinsrb_avx(auVar3,0,0xf);
        uStack_410 = auVar3._0_8_;
        uStack_408 = auVar3._8_8_;
        auVar30._16_8_ = uStack_410;
        auVar30._0_16_ = auVar44;
        auVar30._24_8_ = uStack_408;
        auVar45 = vpshufb_avx2(auVar5,auVar30);
        auStack_23d0 = auVar45._16_16_;
        auVar44._8_8_ = uStack_23f8;
        auVar44._0_8_ = local_2400;
        auVar44 = vpunpckldq_avx(auStack_23d0,auVar44);
        local_2410 = auVar44._0_8_;
        *(undefined8 *)(local_3350 + local_3a84) = local_2410;
      }
    }
    return;
  }
  __assert_fail("weight_count > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_ideal_endpoints_and_weights.cpp"
                ,0x3d8,
                "void compute_quantized_weights_for_decimation(const decimation_info &, float, float, const float *, float *, uint8_t *, quant_method)"
               );
}

Assistant:

void compute_quantized_weights_for_decimation(
	const decimation_info& di,
	float low_bound,
	float high_bound,
	const float* dec_weight_ideal_value,
	float* weight_set_out,
	uint8_t* quantized_weight_set,
	quant_method quant_level
) {
	int weight_count = di.weight_count;
	promise(weight_count > 0);
	const quant_and_transfer_table& qat = quant_and_xfer_tables[quant_level];

	// The available quant levels, stored with a minus 1 bias
	static const float quant_levels_m1[12] {
		1.0f, 2.0f, 3.0f, 4.0f, 5.0f, 7.0f, 9.0f, 11.0f, 15.0f, 19.0f, 23.0f, 31.0f
	};

	vint steps_m1(get_quant_level(quant_level) - 1);
	float quant_level_m1 = quant_levels_m1[quant_level];

	// Quantize the weight set using both the specified low/high bounds and standard 0..1 bounds

	// TODO: Oddity to investigate; triggered by test in issue #265.
	if (high_bound <= low_bound)
	{
		low_bound = 0.0f;
		high_bound = 1.0f;
	}

	float rscale = high_bound - low_bound;
	float scale = 1.0f / rscale;

	float scaled_low_bound = low_bound * scale;
	rscale *= 1.0f / 64.0f;

	vfloat scalev(scale);
	vfloat scaled_low_boundv(scaled_low_bound);
	vfloat quant_level_m1v(quant_level_m1);
	vfloat rscalev(rscale);
	vfloat low_boundv(low_bound);

	// This runs to the rounded-up SIMD size, which is safe as the loop tail is filled with known
	// safe data in compute_ideal_weights_for_decimation and arrays are always 64 elements
	if (get_quant_level(quant_level) <= 16)
	{
		vtable_16x8 table;
		vtable_prepare(table, qat.quant_to_unquant);

		for (int i = 0; i < weight_count; i += ASTCENC_SIMD_WIDTH)
		{
			vfloat ix = loada(dec_weight_ideal_value + i) * scalev - scaled_low_boundv;
			ix = clampzo(ix);

			// Look up the two closest indexes and return the one that was closest
			vfloat ix1 = ix * quant_level_m1v;

			vint weightl = float_to_int(ix1);
			vint weighth = min(weightl + vint(1), steps_m1);

			vint ixli = vtable_lookup_32bit(table, weightl);
			vint ixhi = vtable_lookup_32bit(table, weighth);

			vfloat ixl = int_to_float(ixli);
			vfloat ixh = int_to_float(ixhi);

			vmask mask = (ixl + ixh) < (vfloat(128.0f) * ix);
			vint weight = select(ixli, ixhi, mask);
			ixl = select(ixl, ixh, mask);

			// Invert the weight-scaling that was done initially
			storea(ixl * rscalev + low_boundv, weight_set_out + i);
			pack_and_store_low_bytes(weight, quantized_weight_set + i);
		}
	}
	else
	{
		vtable_32x8 table;
		vtable_prepare(table, qat.quant_to_unquant);

		for (int i = 0; i < weight_count; i += ASTCENC_SIMD_WIDTH)
		{
			vfloat ix = loada(dec_weight_ideal_value + i) * scalev - scaled_low_boundv;
			ix = clampzo(ix);

			// Look up the two closest indexes and return the one that was closest
			vfloat ix1 = ix * quant_level_m1v;

			vint weightl = float_to_int(ix1);
			vint weighth = min(weightl + vint(1), steps_m1);

			vint ixli = vtable_lookup_32bit(table, weightl);
			vint ixhi = vtable_lookup_32bit(table, weighth);

			vfloat ixl = int_to_float(ixli);
			vfloat ixh = int_to_float(ixhi);

			vmask mask = (ixl + ixh) < (vfloat(128.0f) * ix);
			vint weight = select(ixli, ixhi, mask);
			ixl = select(ixl, ixh, mask);

			// Invert the weight-scaling that was done initially
			storea(ixl * rscalev + low_boundv, weight_set_out + i);
			pack_and_store_low_bytes(weight, quantized_weight_set + i);
		}
	}
}